

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::CubicSpline::apply_permutation
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CubicSpline *this,
          vector<double,_std::allocator<double>_> *v,vector<int,_std::allocator<int>_> *p)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  size_type sVar4;
  size_type __n;
  allocator_type local_21;
  
  __n = (long)(p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start >> 2;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_21);
  piVar1 = (p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar4 = 0; __n != sVar4; sVar4 = sVar4 + 1) {
    pdVar3[sVar4] = pdVar2[piVar1[sVar4]];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> CubicSpline::apply_permutation(
      const std::vector<RealType>& v, const std::vector<int>& p) const {
    std::size_t n = p.size();
    std::vector<RealType> sorted_vec(n);

    for (std::size_t i = 0; i < n; ++i) {
      sorted_vec[i] = v[p[i]];
    }

    return sorted_vec;
  }